

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_stats.cpp
# Opt level: O0

FilterPropagateResult
duckdb::CheckZonemapTemplated<int>
          (BaseStatistics *stats,ExpressionType comparison_type,int min_value,int max_value,
          int constant)

{
  bool bVar1;
  InternalException *this;
  undefined1 in_SIL;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  int *in_stack_ffffffffffffff90;
  int min;
  allocator local_41;
  string local_40 [32];
  int local_20;
  int local_1c;
  int local_18 [5];
  FilterPropagateResult local_1;
  
  min = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  switch(in_SIL) {
  case 0x19:
  case 0x28:
    bVar1 = ConstantExactRange<int>(min,(int)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    if (bVar1) {
      local_1 = FILTER_ALWAYS_TRUE;
    }
    else {
      bVar1 = ConstantValueInRange<int>
                        ((int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                         (int)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      if (bVar1) {
        local_1 = NO_PRUNING_POSSIBLE;
      }
      else {
        local_1 = FILTER_ALWAYS_FALSE;
      }
    }
    break;
  case 0x1a:
  case 0x25:
    bVar1 = ConstantValueInRange<int>(min,(int)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    if (bVar1) {
      bVar1 = ConstantExactRange<int>
                        ((int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                         (int)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      if (bVar1) {
        local_1 = FILTER_ALWAYS_FALSE;
      }
      else {
        local_1 = NO_PRUNING_POSSIBLE;
      }
    }
    else {
      local_1 = FILTER_ALWAYS_TRUE;
    }
    break;
  case 0x1b:
    bVar1 = LessThan::Operation<int>
                      (in_stack_ffffffffffffff90,
                       (int *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    if (bVar1) {
      local_1 = FILTER_ALWAYS_TRUE;
    }
    else {
      bVar1 = LessThan::Operation<int>
                        (in_stack_ffffffffffffff90,
                         (int *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      if (bVar1) {
        local_1 = NO_PRUNING_POSSIBLE;
      }
      else {
        local_1 = FILTER_ALWAYS_FALSE;
      }
    }
    break;
  case 0x1c:
    bVar1 = GreaterThan::Operation<int>(local_18,&local_20);
    if (bVar1) {
      local_1 = FILTER_ALWAYS_TRUE;
    }
    else {
      bVar1 = GreaterThan::Operation<int>(&local_1c,&local_20);
      if (bVar1) {
        local_1 = NO_PRUNING_POSSIBLE;
      }
      else {
        local_1 = FILTER_ALWAYS_FALSE;
      }
    }
    break;
  case 0x1d:
    bVar1 = LessThanEquals::Operation<int>
                      (in_stack_ffffffffffffff90,
                       (int *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    if (bVar1) {
      local_1 = FILTER_ALWAYS_TRUE;
    }
    else {
      bVar1 = LessThanEquals::Operation<int>
                        (in_stack_ffffffffffffff90,
                         (int *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      if (bVar1) {
        local_1 = NO_PRUNING_POSSIBLE;
      }
      else {
        local_1 = FILTER_ALWAYS_FALSE;
      }
    }
    break;
  case 0x1e:
    bVar1 = GreaterThanEquals::Operation<int>
                      (in_stack_ffffffffffffff90,
                       (int *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    if (bVar1) {
      local_1 = FILTER_ALWAYS_TRUE;
    }
    else {
      bVar1 = GreaterThanEquals::Operation<int>
                        (in_stack_ffffffffffffff90,
                         (int *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      if (bVar1) {
        local_1 = NO_PRUNING_POSSIBLE;
      }
      else {
        local_1 = FILTER_ALWAYS_FALSE;
      }
    }
    break;
  default:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_40,"Expression type in zonemap check not implemented",&local_41);
    InternalException::InternalException
              (this,(string *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    __cxa_throw(this,&InternalException::typeinfo,InternalException::~InternalException);
  }
  return local_1;
}

Assistant:

FilterPropagateResult CheckZonemapTemplated(const BaseStatistics &stats, ExpressionType comparison_type, T min_value,
                                            T max_value, T constant) {
	switch (comparison_type) {
	case ExpressionType::COMPARE_EQUAL:
	case ExpressionType::COMPARE_NOT_DISTINCT_FROM:
		if (ConstantExactRange(min_value, max_value, constant)) {
			return FilterPropagateResult::FILTER_ALWAYS_TRUE;
		}
		if (ConstantValueInRange(min_value, max_value, constant)) {
			return FilterPropagateResult::NO_PRUNING_POSSIBLE;
		}
		return FilterPropagateResult::FILTER_ALWAYS_FALSE;
	case ExpressionType::COMPARE_NOTEQUAL:
	case ExpressionType::COMPARE_DISTINCT_FROM:
		if (!ConstantValueInRange(min_value, max_value, constant)) {
			return FilterPropagateResult::FILTER_ALWAYS_TRUE;
		} else if (ConstantExactRange(min_value, max_value, constant)) {
			// corner case of a cluster with one numeric equal to the target constant
			return FilterPropagateResult::FILTER_ALWAYS_FALSE;
		}
		return FilterPropagateResult::NO_PRUNING_POSSIBLE;
	case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
		// GreaterThanEquals::Operation(X, C)
		// this can be true only if max(X) >= C
		// if min(X) >= C, then this is always true
		if (GreaterThanEquals::Operation(min_value, constant)) {
			return FilterPropagateResult::FILTER_ALWAYS_TRUE;
		} else if (GreaterThanEquals::Operation(max_value, constant)) {
			return FilterPropagateResult::NO_PRUNING_POSSIBLE;
		} else {
			return FilterPropagateResult::FILTER_ALWAYS_FALSE;
		}
	case ExpressionType::COMPARE_GREATERTHAN:
		// GreaterThan::Operation(X, C)
		// this can be true only if max(X) > C
		// if min(X) > C, then this is always true
		if (GreaterThan::Operation(min_value, constant)) {
			return FilterPropagateResult::FILTER_ALWAYS_TRUE;
		} else if (GreaterThan::Operation(max_value, constant)) {
			return FilterPropagateResult::NO_PRUNING_POSSIBLE;
		} else {
			return FilterPropagateResult::FILTER_ALWAYS_FALSE;
		}
	case ExpressionType::COMPARE_LESSTHANOREQUALTO:
		// LessThanEquals::Operation(X, C)
		// this can be true only if min(X) <= C
		// if max(X) <= C, then this is always true
		if (LessThanEquals::Operation(max_value, constant)) {
			return FilterPropagateResult::FILTER_ALWAYS_TRUE;
		} else if (LessThanEquals::Operation(min_value, constant)) {
			return FilterPropagateResult::NO_PRUNING_POSSIBLE;
		} else {
			return FilterPropagateResult::FILTER_ALWAYS_FALSE;
		}
	case ExpressionType::COMPARE_LESSTHAN:
		// LessThan::Operation(X, C)
		// this can be true only if min(X) < C
		// if max(X) < C, then this is always true
		if (LessThan::Operation(max_value, constant)) {
			return FilterPropagateResult::FILTER_ALWAYS_TRUE;
		} else if (LessThan::Operation(min_value, constant)) {
			return FilterPropagateResult::NO_PRUNING_POSSIBLE;
		} else {
			return FilterPropagateResult::FILTER_ALWAYS_FALSE;
		}
	default:
		throw InternalException("Expression type in zonemap check not implemented");
	}
}